

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_pasv_resp(connectdata *conn,int ftpcode)

{
  int iVar1;
  CURLcode CVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  SessionHandle *data;
  char separator [4];
  Curl_dns_entry *addr;
  uint num;
  undefined4 local_160;
  short local_15c [2];
  Curl_dns_entry *local_158;
  int local_14c;
  connectdata *local_148;
  SessionHandle *local_140;
  uint local_138;
  uint local_134;
  uint local_130;
  uint local_12c [63];
  
  data = conn->data;
  local_158 = (Curl_dns_entry *)0x0;
  pcVar3 = (data->state).buffer + 4;
  (*Curl_cfree)((conn->proto).ftpc.newhost);
  (conn->proto).ftpc.newhost = (char *)0x0;
  iVar1 = (conn->proto).ftpc.count1;
  if (ftpcode == 0xe5 && iVar1 == 0) {
    pcVar3 = strchr(pcVar3,0x28);
    if ((pcVar3 == (char *)0x0) ||
       (iVar1 = __isoc99_sscanf(pcVar3 + 1,"%c%c%c%u%c",&local_160,(long)&local_160 + 1,
                                (long)&local_160 + 2,&local_138,(long)&local_160 + 3), iVar1 != 5))
    {
LAB_004e53dc:
      pcVar3 = "Weirdly formatted EPSV reply";
    }
    else {
      lVar4 = 1;
      do {
        if (*(char *)((long)local_15c + lVar4 + -4) != (char)local_160) {
          if (local_138 < 0x10000) goto LAB_004e53dc;
          goto LAB_004e53d3;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      if (local_138 < 0x10000) {
        (conn->proto).ftpc.newport = (unsigned_short)local_138;
        if (((conn->bits).tunnel_proxy == false) &&
           ((conn->proxytype & 0xfffffffc) != CURLPROXY_SOCKS4)) {
          pcVar3 = conn->ip_addr_str;
        }
        else {
          pcVar3 = (conn->host).name;
        }
        pcVar3 = (*Curl_cstrdup)(pcVar3);
        (conn->proto).ftpc.newhost = pcVar3;
        if (pcVar3 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
LAB_004e54f7:
        if ((conn->bits).proxy == true) {
          Curl_resolv(conn,(conn->proxy).name,(int)conn->port,&local_158);
          uVar5 = conn->port;
          if (local_158 != (Curl_dns_entry *)0x0) {
LAB_004e557f:
            (conn->bits).tcpconnect[1] = false;
            CVar2 = Curl_connecthost(conn,local_158);
            if (CVar2 == CURLE_OK) {
              if ((data->set).verbose == true) {
                pcVar3 = (conn->proto).ftpc.newhost;
                Curl_printable_address(local_158->addr,(char *)&local_138,0x100);
                Curl_infof(conn->data,"Connecting to %s (%s) port %d\n",pcVar3,&local_138,
                           uVar5 & 0xffff);
              }
              Curl_resolv_unlock(data,local_158);
              (conn->bits).do_more = true;
              (conn->proto).ftpc.state = FTP_STOP;
              return CURLE_OK;
            }
            Curl_resolv_unlock(data,local_158);
            if (ftpcode == 0xe5) {
              if ((conn->proto).ftpc.count1 == 0) {
                CVar2 = ftp_epsv_disable(conn);
                return CVar2;
              }
              return CVar2;
            }
            return CVar2;
          }
          pcVar3 = (conn->proxy).name;
          uVar5 = uVar5 & 0xffff;
          pcVar6 = "Can\'t resolve proxy host %s:%hu";
        }
        else {
          Curl_resolv(conn,pcVar3,(uint)(conn->proto).ftpc.newport,&local_158);
          uVar5 = (ulong)(conn->proto).ftpc.newport;
          if (local_158 != (Curl_dns_entry *)0x0) goto LAB_004e557f;
          pcVar3 = (conn->proto).ftpc.newhost;
          pcVar6 = "Can\'t resolve new host %s:%hu";
        }
        Curl_failf(data,pcVar6,pcVar3,uVar5);
        return CURLE_FTP_CANT_GET_HOST;
      }
LAB_004e53d3:
      pcVar3 = "Illegal port number in EPSV reply";
    }
    Curl_failf(data,pcVar3);
  }
  else {
    if (ftpcode == 0xe3 && iVar1 == 1) {
      local_14c = ftpcode;
      local_148 = conn;
      local_140 = data;
      if (*pcVar3 != '\0') {
        do {
          iVar1 = __isoc99_sscanf(pcVar3,"%d,%d,%d,%d,%d,%d",&local_138,&local_134,&local_130,
                                  local_12c,&local_160,local_15c);
          data = local_140;
          conn = local_148;
          if (iVar1 == 6) {
            if (*pcVar3 != '\0') {
              if ((local_140->set).ftp_skip_ip == true) {
                Curl_infof(local_140,"Skip %d.%d.%d.%d for data connection, re-use %s instead\n");
                if (((conn->bits).tunnel_proxy == false) &&
                   ((conn->proxytype & 0xfffffffc) != CURLPROXY_SOCKS4)) {
                  pcVar3 = conn->ip_addr_str;
                }
                else {
                  pcVar3 = (conn->host).name;
                }
                pcVar3 = (*Curl_cstrdup)(pcVar3);
              }
              else {
                pcVar3 = curl_maprintf("%d.%d.%d.%d",(ulong)local_138,(ulong)local_134,
                                       (ulong)local_130,(ulong)local_12c[0]);
                conn = local_148;
              }
              (conn->proto).ftpc.newhost = pcVar3;
              if (pcVar3 == (char *)0x0) {
                return CURLE_OUT_OF_MEMORY;
              }
              (conn->proto).ftpc.newport = (short)(local_160 << 8) + local_15c[0];
              ftpcode = local_14c;
              goto LAB_004e54f7;
            }
            break;
          }
          pcVar6 = pcVar3 + 1;
          pcVar3 = pcVar3 + 1;
        } while (*pcVar6 != '\0');
      }
      Curl_failf(local_140,"Couldn\'t interpret the 227-response");
      return CURLE_FTP_WEIRD_227_FORMAT;
    }
    if (iVar1 == 0) {
      CVar2 = ftp_epsv_disable(conn);
      return CVar2;
    }
    Curl_failf(data,"Bad PASV/EPSV response: %03d",ftpcode);
  }
  return CURLE_FTP_WEIRD_PASV_REPLY;
}

Assistant:

static CURLcode ftp_state_pasv_resp(struct connectdata *conn,
                                    int ftpcode)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result;
  struct SessionHandle *data=conn->data;
  struct Curl_dns_entry *addr=NULL;
  int rc;
  unsigned short connectport; /* the local port connect() should use! */
  char *str=&data->state.buffer[4];  /* start on the first letter */

  /* if we come here again, make sure the former name is cleared */
  Curl_safefree(ftpc->newhost);

  if((ftpc->count1 == 0) &&
     (ftpcode == 229)) {
    /* positive EPSV response */
    char *ptr = strchr(str, '(');
    if(ptr) {
      unsigned int num;
      char separator[4];
      ptr++;
      if(5 == sscanf(ptr, "%c%c%c%u%c",
                     &separator[0],
                     &separator[1],
                     &separator[2],
                     &num,
                     &separator[3])) {
        const char sep1 = separator[0];
        int i;

        /* The four separators should be identical, or else this is an oddly
           formatted reply and we bail out immediately. */
        for(i=1; i<4; i++) {
          if(separator[i] != sep1) {
            ptr=NULL; /* set to NULL to signal error */
            break;
          }
        }
        if(num > 0xffff) {
          failf(data, "Illegal port number in EPSV reply");
          return CURLE_FTP_WEIRD_PASV_REPLY;
        }
        if(ptr) {
          ftpc->newport = (unsigned short)(num & 0xffff);
          ftpc->newhost = strdup(control_address(conn));
          if(!ftpc->newhost)
            return CURLE_OUT_OF_MEMORY;
        }
      }
      else
        ptr=NULL;
    }
    if(!ptr) {
      failf(data, "Weirdly formatted EPSV reply");
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else if((ftpc->count1 == 1) &&
          (ftpcode == 227)) {
    /* positive PASV response */
    int ip[4];
    int port[2];

    /*
     * Scan for a sequence of six comma-separated numbers and use them as
     * IP+port indicators.
     *
     * Found reply-strings include:
     * "227 Entering Passive Mode (127,0,0,1,4,51)"
     * "227 Data transfer will passively listen to 127,0,0,1,4,51"
     * "227 Entering passive mode. 127,0,0,1,4,51"
     */
    while(*str) {
      if(6 == sscanf(str, "%d,%d,%d,%d,%d,%d",
                     &ip[0], &ip[1], &ip[2], &ip[3],
                     &port[0], &port[1]))
        break;
      str++;
    }

    if(!*str) {
      failf(data, "Couldn't interpret the 227-response");
      return CURLE_FTP_WEIRD_227_FORMAT;
    }

    /* we got OK from server */
    if(data->set.ftp_skip_ip) {
      /* told to ignore the remotely given IP but instead use the host we used
         for the control connection */
      infof(data, "Skip %d.%d.%d.%d for data connection, re-use %s instead\n",
            ip[0], ip[1], ip[2], ip[3],
            conn->host.name);
      ftpc->newhost = strdup(control_address(conn));
    }
    else
      ftpc->newhost = aprintf("%d.%d.%d.%d", ip[0], ip[1], ip[2], ip[3]);

    if(!ftpc->newhost)
      return CURLE_OUT_OF_MEMORY;

    ftpc->newport = (unsigned short)(((port[0]<<8) + port[1]) & 0xffff);
  }
  else if(ftpc->count1 == 0) {
    /* EPSV failed, move on to PASV */
    return ftp_epsv_disable(conn);
  }
  else {
    failf(data, "Bad PASV/EPSV response: %03d", ftpcode);
    return CURLE_FTP_WEIRD_PASV_REPLY;
  }

  if(conn->bits.proxy) {
    /*
     * This connection uses a proxy and we need to connect to the proxy again
     * here. We don't want to rely on a former host lookup that might've
     * expired now, instead we remake the lookup here and now!
     */
    rc = Curl_resolv(conn, conn->proxy.name, (int)conn->port, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING, ignores the return code but 'addr' will be NULL in
         case of failure */
      (void)Curl_resolver_wait_resolv(conn, &addr);

    connectport =
      (unsigned short)conn->port; /* we connect to the proxy's port */

    if(!addr) {
      failf(data, "Can't resolve proxy host %s:%hu",
            conn->proxy.name, connectport);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }
  else {
    /* normal, direct, ftp connection */
    rc = Curl_resolv(conn, ftpc->newhost, ftpc->newport, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING */
      (void)Curl_resolver_wait_resolv(conn, &addr);

    connectport = ftpc->newport; /* we connect to the remote port */

    if(!addr) {
      failf(data, "Can't resolve new host %s:%hu", ftpc->newhost, connectport);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }

  conn->bits.tcpconnect[SECONDARYSOCKET] = FALSE;
  result = Curl_connecthost(conn, addr);

  if(result) {
    Curl_resolv_unlock(data, addr); /* we're done using this address */
    if(ftpc->count1 == 0 && ftpcode == 229)
      return ftp_epsv_disable(conn);

    return result;
  }


  /*
   * When this is used from the multi interface, this might've returned with
   * the 'connected' set to FALSE and thus we are now awaiting a non-blocking
   * connect to connect.
   */

  if(data->set.verbose)
    /* this just dumps information about this second connection */
    ftp_pasv_verbose(conn, addr->addr, ftpc->newhost, connectport);

  Curl_resolv_unlock(data, addr); /* we're done using this address */
  conn->bits.do_more = TRUE;
  state(conn, FTP_STOP); /* this phase is completed */

  return result;
}